

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall CP::queue<int>::queue(queue<int> *this,queue<int> *a)

{
  ulong uVar1;
  int *piVar2;
  int *__s;
  size_t i;
  ulong uVar3;
  
  uVar1 = a->mCap;
  uVar3 = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
  __s = (int *)operator_new__(uVar3);
  memset(__s,0,uVar3);
  this->mData = __s;
  this->mCap = uVar1;
  this->mSize = a->mSize;
  piVar2 = a->mData;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    __s[uVar3] = piVar2[uVar3];
  }
  this->mFront = a->mFront;
  return;
}

Assistant:

queue(const queue<T>& a) {
      this->mData = new T[a.mCap]();
      this->mCap = a.mCap;
      this->mSize = a.mSize;
      for (size_t i = 0; i < a.mCap;i++) {
        mData[i] = a.mData[i];
      }
      this->mFront = a.mFront;
    }